

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergeFrom
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *from)

{
  void *pvVar1;
  DefaultClassLabelUnion DVar2;
  LogMessage *other;
  NearestNeighborsIndex *this_00;
  Int64Parameter *this_01;
  StringVector *this_02;
  Int64Vector *this_03;
  StringVector *from_00;
  Int64Vector *from_01;
  UniformWeighting *this_04;
  InverseDistanceWeighting *this_05;
  NearestNeighborsIndex *from_02;
  Int64Parameter *from_03;
  UniformWeighting *from_04;
  InverseDistanceWeighting *from_05;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x260);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_02 = from->nearestneighborsindex_;
  if (from_02 != (NearestNeighborsIndex *)0x0 &&
      from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    this_00 = this->nearestneighborsindex_;
    if (this_00 == (NearestNeighborsIndex *)0x0) {
      this_00 = (NearestNeighborsIndex *)operator_new(0x50);
      NearestNeighborsIndex::NearestNeighborsIndex(this_00);
      this->nearestneighborsindex_ = this_00;
      from_02 = from->nearestneighborsindex_;
    }
    if (from_02 == (NearestNeighborsIndex *)0x0) {
      from_02 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
    }
    NearestNeighborsIndex::MergeFrom(this_00,from_02);
  }
  from_03 = from->numberofneighbors_;
  if (from_03 != (Int64Parameter *)0x0 &&
      from != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    this_01 = this->numberofneighbors_;
    if (this_01 == (Int64Parameter *)0x0) {
      this_01 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(this_01);
      this->numberofneighbors_ = this_01;
      from_03 = from->numberofneighbors_;
    }
    if (from_03 == (Int64Parameter *)0x0) {
      from_03 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this_01,from_03);
  }
  if (from->_oneof_case_[0] == 0x65) {
    if (this->_oneof_case_[0] == 0x65) {
      this_03 = (this->ClassLabels_).int64classlabels_;
LAB_001f73da:
      from_01 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 0x65;
      this_03 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(this_03);
      (this->ClassLabels_).int64classlabels_ = this_03;
      if (from->_oneof_case_[0] == 0x65) goto LAB_001f73da;
      from_01 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_03,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] == 100) {
      this_02 = (this->ClassLabels_).stringclasslabels_;
LAB_001f73a5:
      from_00 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      this_02 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(this_02);
      (this->ClassLabels_).stringclasslabels_ = this_02;
      if (from->_oneof_case_[0] == 100) goto LAB_001f73a5;
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_02,from_00);
  }
  if (from->_oneof_case_[1] == 0x6f) {
    DVar2 = from->DefaultClassLabel_;
    if (this->_oneof_case_[1] != 0x6f) {
      clear_DefaultClassLabel(this);
      this->_oneof_case_[1] = 0x6f;
    }
    this->DefaultClassLabel_ = DVar2;
  }
  else if (from->_oneof_case_[1] == 0x6e) {
    DVar2 = from->DefaultClassLabel_;
    if (this->_oneof_case_[1] == 0x6e) {
      if ((string *)(this->DefaultClassLabel_).defaultint64label_ !=
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)(this->DefaultClassLabel_).defaultint64label_);
        goto LAB_001f7479;
      }
    }
    else {
      clear_DefaultClassLabel(this);
      this->_oneof_case_[1] = 0x6e;
      (this->DefaultClassLabel_).defaultint64label_ =
           (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->DefaultClassLabel_).defaultstringlabel_,(string *)DVar2);
  }
LAB_001f7479:
  if (from->_oneof_case_[2] != 0xd2) {
    if (from->_oneof_case_[2] != 200) {
      return;
    }
    if (this->_oneof_case_[2] == 200) {
      this_04 = (this->WeightingScheme_).uniformweighting_;
    }
    else {
      clear_WeightingScheme(this);
      this->_oneof_case_[2] = 200;
      this_04 = (UniformWeighting *)operator_new(0x18);
      UniformWeighting::UniformWeighting(this_04);
      (this->WeightingScheme_).uniformweighting_ = this_04;
      if (from->_oneof_case_[2] != 200) {
        protobuf_NearestNeighbors_2eproto::InitDefaults();
        from_04 = (UniformWeighting *)&_UniformWeighting_default_instance_;
        goto LAB_001f752a;
      }
    }
    from_04 = (from->WeightingScheme_).uniformweighting_;
LAB_001f752a:
    UniformWeighting::MergeFrom(this_04,from_04);
    return;
  }
  if (this->_oneof_case_[2] == 0xd2) {
    this_05 = (this->WeightingScheme_).inversedistanceweighting_;
  }
  else {
    clear_WeightingScheme(this);
    this->_oneof_case_[2] = 0xd2;
    this_05 = (InverseDistanceWeighting *)operator_new(0x18);
    InverseDistanceWeighting::InverseDistanceWeighting(this_05);
    (this->WeightingScheme_).inversedistanceweighting_ = this_05;
    if (from->_oneof_case_[2] != 0xd2) {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_05 = (InverseDistanceWeighting *)&_InverseDistanceWeighting_default_instance_;
      goto LAB_001f7540;
    }
  }
  from_05 = (from->WeightingScheme_).inversedistanceweighting_;
LAB_001f7540:
  InverseDistanceWeighting::MergeFrom(this_05,from_05);
  return;
}

Assistant:

void KNearestNeighborsClassifier::MergeFrom(const KNearestNeighborsClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.KNearestNeighborsClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_nearestneighborsindex()) {
    mutable_nearestneighborsindex()->::CoreML::Specification::NearestNeighborsIndex::MergeFrom(from.nearestneighborsindex());
  }
  if (from.has_numberofneighbors()) {
    mutable_numberofneighbors()->::CoreML::Specification::Int64Parameter::MergeFrom(from.numberofneighbors());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  switch (from.DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      set_defaultstringlabel(from.defaultstringlabel());
      break;
    }
    case kDefaultInt64Label: {
      set_defaultint64label(from.defaultint64label());
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  switch (from.WeightingScheme_case()) {
    case kUniformWeighting: {
      mutable_uniformweighting()->::CoreML::Specification::UniformWeighting::MergeFrom(from.uniformweighting());
      break;
    }
    case kInverseDistanceWeighting: {
      mutable_inversedistanceweighting()->::CoreML::Specification::InverseDistanceWeighting::MergeFrom(from.inversedistanceweighting());
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
}